

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteSInt32
               (int field_number,int32 value,CodedOutputStream *output)

{
  CodedOutputStream *in_RDX;
  int32 in_ESI;
  int in_EDI;
  uint32 in_stack_ffffffffffffffbc;
  CodedOutputStream *pCVar1;
  CodedOutputStream *this;
  
  pCVar1 = in_RDX;
  MakeTag(in_EDI,WIRETYPE_VARINT);
  io::CodedOutputStream::WriteTag(in_RDX,in_stack_ffffffffffffffbc);
  this = pCVar1;
  ZigZagEncode32(in_ESI);
  io::CodedOutputStream::WriteVarint32(this,(uint32)((ulong)pCVar1 >> 0x20));
  return;
}

Assistant:

void WireFormatLite::WriteSInt32(int field_number, int32 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteSInt32NoTag(value, output);
}